

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
CP::vector<std::pair<int,_int>_>::expand(vector<std::pair<int,_int>_> *this,size_t capacity)

{
  pair<int,_int> *ppVar1;
  size_t sVar2;
  pair<int,_int> *__s;
  size_t i;
  size_t sVar3;
  
  __s = (pair<int,_int> *)operator_new__(-(ulong)(capacity >> 0x3d != 0) | capacity * 8);
  if (capacity != 0) {
    memset(__s,0,capacity * 8);
  }
  ppVar1 = this->mData;
  sVar2 = this->mSize;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    __s[sVar3] = ppVar1[sVar3];
  }
  if (ppVar1 != (pair<int,_int> *)0x0) {
    operator_delete__(ppVar1);
  }
  this->mData = __s;
  this->mCap = capacity;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[i];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
    }